

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void profileMode(Problem *problem)

{
  int iVar1;
  Problem *this;
  UnitList **ppUVar2;
  ostream *poVar3;
  uint64_t uVar4;
  Problem *in_RDI;
  Property *property;
  ScopedPtr<Kernel::Problem> prb;
  Property *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Problem *in_stack_ffffffffffffff28;
  TheoryFinder *in_stack_ffffffffffffff30;
  string local_80 [32];
  TheoryFinder local_60 [4];
  Property *local_18;
  ScopedPtr<Kernel::Problem> local_10 [2];
  
  Lib::ScopedPtr<Kernel::Problem>::ScopedPtr(local_10,in_RDI);
  Lib::ScopedPtr<Kernel::Problem>::operator->(local_10);
  local_18 = Kernel::Problem::getProperty
                       ((Problem *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  Shell::Normalisation::Normalisation((Normalisation *)0x1838d5);
  Lib::ScopedPtr<Kernel::Problem>::operator*(local_10);
  Shell::Normalisation::normalise
            ((Normalisation *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Shell::Normalisation::~Normalisation((Normalisation *)0x18390c);
  this = Lib::ScopedPtr<Kernel::Problem>::operator->(local_10);
  ppUVar2 = Kernel::Problem::units(this);
  Shell::TheoryFinder::TheoryFinder(local_60,*ppUVar2,local_18);
  Shell::TheoryFinder::search(in_stack_ffffffffffffff30);
  Shell::TheoryFinder::~TheoryFinder(local_60);
  Shell::Property::categoryString_abi_cxx11_(in_stack_ffffffffffffff18);
  poVar3 = std::operator<<((ostream *)&std::cout,local_80);
  poVar3 = std::operator<<(poVar3,' ');
  uVar4 = Shell::Property::props(local_18);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
  poVar3 = std::operator<<(poVar3,' ');
  iVar1 = Shell::Property::atoms(local_18);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_80);
  vampireReturnValue = 0;
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr
            ((ScopedPtr<Kernel::Problem> *)CONCAT44(iVar1,in_stack_ffffffffffffff20));
  return;
}

Assistant:

void profileMode(Problem* problem)
{
  ScopedPtr<Problem> prb(problem);

  /* CAREFUL: Make sure that the order
   * 1) getProperty, 2) normalise, 3) TheoryFinder::search
   * is the same as in PortfolioMode::searchForProof
   * also, cf. the beginning of Preprocessing::preprocess*/
  Property* property = prb->getProperty();
  Normalisation().normalise(*prb);
  TheoryFinder(prb->units(), property).search();

  std::cout << property->categoryString() << ' ' << property->props() << ' '
	  << property->atoms() << "\n";

  //we have succeeded with the profile mode, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}